

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
mpt::typed_array<mpt::reference<mpt::metatype>_>::typed_array
          (typed_array<mpt::reference<mpt::metatype>_> *this,long len)

{
  int iVar1;
  undefined4 extraout_var;
  content<mpt::reference<mpt::metatype>_> *local_48;
  content<mpt::reference<mpt::metatype>_> *local_30;
  content<mpt::reference<mpt::metatype>_> *data;
  long len_local;
  typed_array<mpt::reference<mpt::metatype>_> *this_local;
  
  unique_array<mpt::reference<mpt::metatype>_>::unique_array
            (&this->super_unique_array<mpt::reference<mpt::metatype>_>,
             (content<mpt::reference<mpt::metatype>_> *)0x0);
  if (typed_array<mpt::reference<mpt::metatype>>::typed_array(long)::_dummy == '\0') {
    iVar1 = __cxa_guard_acquire(&typed_array<mpt::reference<mpt::metatype>>::typed_array(long)::
                                 _dummy);
    if (iVar1 != 0) {
      default_data::default_data(&typed_array::_dummy);
      __cxa_atexit(default_data::~default_data,&typed_array::_dummy,&__dso_handle);
      __cxa_guard_release(&typed_array<mpt::reference<mpt::metatype>>::typed_array(long)::_dummy);
    }
  }
  local_30 = (content<mpt::reference<mpt::metatype>_> *)&typed_array::_dummy;
  if (-1 < len) {
    iVar1 = (*typed_array::_dummy.super_default_data.super_content<mpt::reference<mpt::metatype>_>.
              super_buffer._vptr_buffer[3])(&typed_array::_dummy,len << 3);
    local_30 = (content<mpt::reference<mpt::metatype>_> *)CONCAT44(extraout_var,iVar1);
  }
  if (local_30 == (content<mpt::reference<mpt::metatype>_> *)0x0) {
    local_48 = (content<mpt::reference<mpt::metatype>_> *)&typed_array::_dummy;
  }
  else {
    local_48 = local_30;
  }
  reference<mpt::content<mpt::reference<mpt::metatype>_>_>::set_instance
            ((reference<mpt::content<mpt::reference<mpt::metatype>_>_> *)this,local_48);
  return;
}

Assistant:

typed_array(long len = -1) : unique_array<T>(static_cast<content<T> *>(0))
	{
		static default_data _dummy;
		content<T> *data = &_dummy;
		if (len >= 0) data = data->detach(len * sizeof(T));
		this->_ref.set_instance(data ? data : &_dummy);
	}